

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCapsuleShape.cpp
# Opt level: O1

void __thiscall chrono::ChCapsuleShape::ChCapsuleShape(ChCapsuleShape *this)

{
  ChVisualShape::ChVisualShape(&this->super_ChVisualShape);
  (this->super_ChVisualShape)._vptr_ChVisualShape = (_func_int **)&PTR__ChCapsuleShape_00b68eb8;
  (this->gcapsule).super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChGeometry_00b654f8;
  (this->gcapsule).rad = 0.0;
  (this->gcapsule).hlen = 0.0;
  (this->super_ChVisualShape).is_mutable = false;
  return;
}

Assistant:

ChCapsuleShape::ChCapsuleShape() {
    SetMutable(false);
}